

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_35::parse_float
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  bool bVar1;
  version vVar2;
  global_object *this_00;
  long *plVar3;
  version ver;
  size_t sVar4;
  wstring_view s_00;
  double local_238;
  double local_208;
  double val;
  allocator<wchar_t> local_1e9;
  mjs *local_1e8;
  size_t sStack_1e0;
  wstring_view local_1d8;
  wstring local_1c8 [32];
  wistream local_1a8 [8];
  wistringstream wiss;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  sVar4 = s._M_len;
  local_1e8 = (mjs *)global;
  sStack_1e0 = sVar4;
  this_00 = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)this);
  ver = (version)sVar4;
  vVar2 = global_object::language_version(this_00);
  s_00._M_str._0_4_ = vVar2;
  s_00._M_len = sStack_1e0;
  s_00._M_str._4_4_ = 0;
  local_1d8 = ltrim(local_1e8,s_00,ver);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            (local_1c8,&local_1d8,&local_1e9);
  std::__cxx11::wistringstream::basic_istringstream(local_1a8,local_1c8,8);
  std::__cxx11::wstring::~wstring(local_1c8);
  std::allocator<wchar_t>::~allocator(&local_1e9);
  plVar3 = (long *)std::wistream::operator>>(local_1a8,&local_208);
  bVar1 = std::wios::operator_cast_to_bool((wios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if (bVar1) {
    local_238 = local_208;
  }
  else {
    local_238 = NAN;
  }
  value::value(__return_storage_ptr__,local_238);
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

value parse_float(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wistringstream wiss{std::wstring{ltrim(s, global->language_version())}};
    double val;
    return value{wiss >> val ? val : NAN};
}